

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::UninterpretedOption::InternalSerializeWithCachedSizesToArray
          (UninterpretedOption *this,bool deterministic,uint8 *target)

{
  int iVar1;
  uint uVar2;
  string *psVar3;
  Type *value;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar4;
  int index;
  
  iVar1 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                      (&(this->name_).super_RepeatedPtrFieldBase,index);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::UninterpretedOption_NamePart>
                       (2,value,deterministic,target);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    psVar3 = (this->identifier_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.UninterpretedOption.identifier_value");
    target = internal::WireFormatLite::WriteStringToArray(3,(this->identifier_value_).ptr_,target);
  }
  if ((uVar2 & 8) != 0) {
    target = internal::WireFormatLite::WriteUInt64ToArray(4,this->positive_int_value_,target);
  }
  if ((uVar2 & 0x10) != 0) {
    target = internal::WireFormatLite::WriteInt64ToArray(5,this->negative_int_value_,target);
  }
  if ((uVar2 & 0x20) != 0) {
    target = internal::WireFormatLite::WriteDoubleToArray(6,this->double_value_,target);
  }
  if ((uVar2 & 2) != 0) {
    target = internal::WireFormatLite::WriteBytesToArray(7,(this->string_value_).ptr_,target);
  }
  if ((uVar2 & 4) != 0) {
    psVar3 = (this->aggregate_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.UninterpretedOption.aggregate_value");
    target = internal::WireFormatLite::WriteStringToArray(8,(this->aggregate_value_).ptr_,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = UninterpretedOption::unknown_fields(this);
  puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,target);
  return puVar4;
}

Assistant:

::google::protobuf::uint8* UninterpretedOption::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0, n = this->name_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->name(i), deterministic, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(4, this->positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt64ToArray(5, this->negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteDoubleToArray(6, this->double_value(), target);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    target =
      ::google::protobuf::internal::WireFormatLite::WriteBytesToArray(
        7, this->string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->aggregate_value(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}